

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

ObjectFormatType parseFormat(StringRef EnvironmentName)

{
  int iVar1;
  ObjectFormatType *pOVar2;
  ulong uVar3;
  char *pcVar4;
  Optional<llvm::Triple::ObjectFormatType> local_18;
  
  uVar3 = EnvironmentName.Length;
  pcVar4 = EnvironmentName.Data;
  if ((uVar3 < 4) || (*(int *)(pcVar4 + (uVar3 - 4)) != 0x66666f63)) {
    if ((uVar3 < 3) || (iVar1 = bcmp(pcVar4 + (uVar3 - 3),"elf",3), iVar1 != 0)) {
      if ((uVar3 < 5) || (iVar1 = bcmp(pcVar4 + (uVar3 - 5),"macho",5), iVar1 != 0)) {
        if (uVar3 < 4) {
          return UnknownObjectFormat;
        }
        if (*(int *)(pcVar4 + (uVar3 - 4)) != 0x6d736177) {
          return UnknownObjectFormat;
        }
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x04';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      }
      else {
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x03';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      }
    }
    else {
      local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x02';
      local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
    }
  }
  else {
    local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x01';
    local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_18.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
  }
  local_18.Storage.hasVal = true;
  pOVar2 = llvm::Optional<llvm::Triple::ObjectFormatType>::getPointer(&local_18);
  return *pOVar2;
}

Assistant:

static Triple::ObjectFormatType parseFormat(StringRef EnvironmentName) {
  return StringSwitch<Triple::ObjectFormatType>(EnvironmentName)
    .EndsWith("coff", Triple::COFF)
    .EndsWith("elf", Triple::ELF)
    .EndsWith("macho", Triple::MachO)
    .EndsWith("wasm", Triple::Wasm)
    .Default(Triple::UnknownObjectFormat);
}